

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  int iVar10;
  int iVar11;
  cmake *pcVar12;
  cmTarget *pcVar13;
  string *psVar14;
  ostream *poVar15;
  size_t sVar16;
  ulong uVar17;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  cmTargetLinkLibraryType llt;
  pointer pbVar18;
  char *pcVar19;
  pointer ppcVar20;
  int iVar21;
  ulong uVar22;
  MessageType t;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  psVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar14 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    bVar5 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,psVar14);
    if (!bVar5) {
      pcVar12 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      pcVar13 = cmGlobalGenerator::FindTarget
                          (pcVar12->GlobalGenerator,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,false);
      this->Target = pcVar13;
      if (pcVar13 == (cmTarget *)0x0) {
        pcVar2 = (this->super_cmCommand).Makefile;
        ppcVar1 = (pcVar2->ImportedTargetsOwned).
                  super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppcVar20 = (pcVar2->ImportedTargetsOwned).
                        super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppcVar20 != ppcVar1;
            ppcVar20 = ppcVar20 + 1) {
          pcVar13 = *ppcVar20;
          psVar14 = cmTarget::GetName_abi_cxx11_(pcVar13);
          pbVar18 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          sVar16 = psVar14->_M_string_length;
          if ((sVar16 == pbVar18->_M_string_length) &&
             ((sVar16 == 0 ||
              (iVar10 = bcmp((psVar14->_M_dataplus)._M_p,(pbVar18->_M_dataplus)._M_p,sVar16),
              iVar10 == 0)))) {
            this->Target = pcVar13;
            break;
          }
        }
      }
      if (this->Target == (cmTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Cannot specify link libraries for target \"",0x2a);
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pbVar18->_M_dataplus)._M_p,
                             pbVar18->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"which is not built by this project.",0x23);
        iVar10 = 2;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016,false);
          if (PVar9 - REQUIRED_IF_USED < 2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c8,(cmPolicies *)0x10,id_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else if (PVar9 == OLD) {
            iVar10 = 4;
          }
          else if (PVar9 == WARN) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "CMake does not support this but it used to work accidentally ",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"and is being allowed for compatibility.",0x27);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x10,id_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            iVar10 = 0;
          }
        }
        if (iVar10 == 2) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::s_FatalErrorOccured = true;
        }
        else if (iVar10 == 0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        TVar8 = cmTarget::GetType(this->Target);
        if (TVar8 == UTILITY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          t = AUTHOR_WARNING;
          PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039,false);
          if (PVar9 - NEW < 3) {
            t = FATAL_ERROR;
            bVar4 = true;
            pcVar19 = "must";
            bVar5 = false;
          }
          else if (PVar9 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x27,id);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                 local_1c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar5 = false;
            pcVar19 = "should";
            bVar4 = false;
            t = AUTHOR_WARNING;
          }
          else {
            bVar5 = true;
            pcVar19 = (char *)0x0;
            bVar4 = false;
          }
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Utility target \"",0x10);
            psVar14 = cmTarget::GetName_abi_cxx11_(this->Target);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(psVar14->_M_dataplus)._M_p,
                                 psVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" ",2);
            sVar16 = strlen(pcVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar19,sVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," not be used as the target of a target_link_libraries call.",0x3b);
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,t,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar4) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              return false;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        if (0x20 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          this->CurrentProcessingState = ProcessingLinkLibraries;
          pbVar18 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          bVar5 = 0x20 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18);
          if (bVar5) {
            bVar4 = false;
            llt = GENERAL_LibraryType;
            uVar17 = 1;
            uVar22 = 2;
LAB_00306724:
            iVar10 = std::__cxx11::string::compare((char *)(pbVar18 + uVar17));
            iVar21 = (int)uVar22;
            if (iVar10 == 0) {
              this->CurrentProcessingState = ProcessingPlainLinkInterface;
              if (iVar21 != 2) {
                pcVar2 = (this->super_cmCommand).Makefile;
                local_1a8._0_8_ = local_1a8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,
                           "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                           ,"");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
LAB_00306d36:
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                bVar7 = true;
                goto LAB_00306a83;
              }
            }
            else {
              iVar10 = std::__cxx11::string::compare
                                 ((char *)((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar17));
              if (iVar10 == 0) {
                if ((iVar21 != 2) &&
                   ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                    ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                  pcVar2 = (this->super_cmCommand).Makefile;
                  local_1a8._0_8_ = local_1a8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,"");
                  cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
                  goto LAB_00306d36;
                }
                this->CurrentProcessingState = ProcessingKeywordLinkInterface;
              }
              else {
                iVar10 = std::__cxx11::string::compare
                                   ((char *)((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar17));
                if (iVar10 == 0) {
                  if (((iVar21 != 2) &&
                      (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                     (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                    pcVar2 = (this->super_cmCommand).Makefile;
                    local_1a8._0_8_ = local_1a8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,"");
                    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
                    goto LAB_00306d36;
                  }
                  this->CurrentProcessingState = ProcessingPlainPublicInterface;
                }
                else {
                  iVar10 = std::__cxx11::string::compare
                                     ((char *)((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar17))
                  ;
                  if (iVar10 == 0) {
                    if ((iVar21 != 2) &&
                       ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                        ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                      pcVar2 = (this->super_cmCommand).Makefile;
                      local_1a8._0_8_ = local_1a8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8,
                                 "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,"");
                      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
                      goto LAB_00306d36;
                    }
                    this->CurrentProcessingState = ProcessingKeywordPublicInterface;
                  }
                  else {
                    iVar10 = std::__cxx11::string::compare
                                       ((char *)((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + uVar17
                                                ));
                    if (iVar10 == 0) {
                      if (((iVar21 != 2) &&
                          (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                         (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                        pcVar2 = (this->super_cmCommand).Makefile;
                        local_1a8._0_8_ = local_1a8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1a8,
                                   "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                                   ,"");
                        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
                        goto LAB_00306d36;
                      }
                      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
                    }
                    else {
                      iVar10 = std::__cxx11::string::compare
                                         ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                      if (iVar10 == 0) {
                        if ((iVar21 != 2) &&
                           ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                            ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                          pcVar2 = (this->super_cmCommand).Makefile;
                          local_1a8._0_8_ = local_1a8 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1a8,
                                     "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                     ,"");
                          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
                          goto LAB_00306d36;
                        }
                        this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
                      }
                      else {
                        iVar10 = std::__cxx11::string::compare
                                           ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                        if (iVar10 == 0) {
                          if (bVar4) {
                            LinkLibraryTypeSpecifierWarning(this,llt,1);
                          }
                          llt = DEBUG_LibraryType;
                        }
                        else {
                          iVar10 = std::__cxx11::string::compare
                                             ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                          if (iVar10 == 0) {
                            if (bVar4) {
                              LinkLibraryTypeSpecifierWarning(this,llt,2);
                            }
                            llt = OPTIMIZED_LibraryType;
                          }
                          else {
                            iVar10 = std::__cxx11::string::compare
                                               ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                            if (iVar10 != 0) {
                              if (!bVar4) {
                                pbVar18 = (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start;
                                local_1a8._0_8_ = local_1a8 + 0x10;
                                pcVar3 = (pbVar18->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)local_1a8,pcVar3,
                                           pcVar3 + pbVar18->_M_string_length);
                                std::__cxx11::string::append(local_1a8);
                                pcVar19 = cmMakefile::GetDefinition
                                                    ((this->super_cmCommand).Makefile,
                                                     (string *)local_1a8);
                                if (pcVar19 == (char *)0x0) {
                                  llt = GENERAL_LibraryType;
                                }
                                else {
                                  iVar10 = strcmp(pcVar19,"debug");
                                  iVar11 = strcmp(pcVar19,"optimized");
                                  llt = OPTIMIZED_LibraryType;
                                  if (iVar11 != 0) {
                                    llt = (cmTargetLinkLibraryType)(iVar10 == 0);
                                  }
                                }
                                bVar7 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,llt);
                                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                                }
                                if (bVar7) goto LAB_0030698c;
                                goto LAB_00306a81;
                              }
                              bVar6 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,llt);
                              bVar4 = false;
                              bVar7 = false;
                              if (!bVar6) goto LAB_00306a83;
                              goto LAB_0030698c;
                            }
                            if (bVar4) {
                              LinkLibraryTypeSpecifierWarning(this,llt,0);
                            }
                            llt = GENERAL_LibraryType;
                          }
                        }
                        bVar4 = true;
                      }
                    }
                  }
                }
              }
            }
LAB_0030698c:
            pbVar18 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5;
            bVar5 = uVar22 < uVar17;
            bVar7 = uVar17 <= uVar22;
            uVar17 = uVar22;
            uVar22 = (ulong)(iVar21 + 1);
            if (bVar7) goto LAB_00306a81;
            goto LAB_00306724;
          }
          llt = GENERAL_LibraryType;
          bVar4 = false;
LAB_00306a81:
          bVar7 = false;
LAB_00306a83:
          if (bVar5) {
            return bVar7;
          }
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The \"",5);
            poVar15 = std::operator<<((ostream *)local_1a8,LinkLibraryTypeNames[llt]);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"\" argument must be followed by a library.",0x29);
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            cmSystemTools::s_FatalErrorOccured = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          PVar9 = cmTarget::GetPolicyStatus(this->Target,CMP0022);
          if (this->CurrentProcessingState == ProcessingLinkLibraries || WARN < PVar9) {
            bVar5 = false;
          }
          else {
            pcVar13 = this->Target;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
            pcVar19 = cmTarget::GetProperty(pcVar13,(string *)local_1a8);
            bVar5 = pcVar19 == (char *)0x0;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
          if (bVar5) {
            pcVar13 = this->Target;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1c8,"LINK_INTERFACE_LIBRARIES","");
            cmTarget::SetProperty(pcVar13,&local_1c8,"");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      return true;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"can not be used on an ALIAS target.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmTargetLinkLibrariesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  // Must have at least one argument.
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Alias targets cannot be on the LHS of this command.
  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    const std::vector<cmTarget*>& importedTargets =
      this->Makefile->GetOwnedImportedTargets();
    for (cmTarget* importedTarget : importedTargets) {
      if (importedTarget->GetName() == args[0]) {
        this->Target = importedTarget;
        break;
      }
    }
  }
  if (!this->Target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (this->Target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "LINK_INTERFACE_LIBRARIES") {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (i != 1) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
    } else if (args[i] == "INTERFACE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
    } else if (args[i] == "LINK_PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
    } else if (args[i] == "PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
    } else if (args[i] == "LINK_PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
    } else if (args[i] == "PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
    } else if (args[i] == "debug") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, DEBUG_LibraryType);
      }
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (args[i] == "optimized") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, OPTIMIZED_LibraryType);
      }
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (args[i] == "general") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, GENERAL_LibraryType);
      }
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    } else {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there may be the case where someone has
      // specified that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = GENERAL_LibraryType;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString = this->Makefile->GetDefinition(linkType);
      if (linkTypeString) {
        if (strcmp(linkTypeString, "debug") == 0) {
          llt = DEBUG_LibraryType;
        }
        if (strcmp(linkTypeString, "optimized") == 0) {
          llt = OPTIMIZED_LibraryType;
        }
      }
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    }
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    std::ostringstream e;
    e << "The \"" << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
  }

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
      !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}